

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSol_SPGMRSetGSType(SUNLinearSolver S,int gstype)

{
  int gstype_local;
  SUNLinearSolver S_local;
  int local_4;
  
  if ((gstype == 1) || (gstype == 2)) {
    if (S == (SUNLinearSolver)0x0) {
      local_4 = -0x321;
    }
    else {
      *(int *)((long)S->content + 8) = gstype;
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x322;
  }
  return local_4;
}

Assistant:

int SUNLinSol_SPGMRSetGSType(SUNLinearSolver S, int gstype)
{
  /* Check for legal gstype */
  if ((gstype != SUN_MODIFIED_GS) && (gstype != SUN_CLASSICAL_GS)) {
    return(SUNLS_ILL_INPUT);
  }

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set pretype */
  SPGMR_CONTENT(S)->gstype = gstype;
  return(SUNLS_SUCCESS);
}